

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

BOOL MAPIsRequestPermissible(DWORD flProtect,CFileProcessLocalData *pFileLocalData)

{
  CFileProcessLocalData *pFileLocalData_local;
  DWORD flProtect_local;
  
  if (((flProtect == 2) || (flProtect == 8)) &&
     ((pFileLocalData->open_flags_deviceaccessonly == 1 || ((pFileLocalData->open_flags & 1U) != 0))
     )) {
    pFileLocalData_local._4_4_ = 0;
  }
  else if ((flProtect == 4) && ((pFileLocalData->open_flags & 2U) == 0)) {
    pFileLocalData_local._4_4_ = 0;
  }
  else {
    pFileLocalData_local._4_4_ = 1;
  }
  return pFileLocalData_local._4_4_;
}

Assistant:

static BOOL MAPIsRequestPermissible( DWORD flProtect, CFileProcessLocalData * pFileLocalData )
{
    if ( ( (flProtect == PAGE_READONLY || flProtect == PAGE_WRITECOPY) && 
           (pFileLocalData->open_flags_deviceaccessonly == TRUE || 
            pFileLocalData->open_flags & O_WRONLY) )
       )
    {
        /*
         * PAGE_READONLY or PAGE_WRITECOPY access to a file must at least be
         * readable. Contrary to what MSDN says, PAGE_WRITECOPY
         * only needs to be readable.
         */
        return FALSE;
    }
    else if ( flProtect == PAGE_READWRITE && !(pFileLocalData->open_flags & O_RDWR) )
    {
        /*
         * PAGE_READWRITE access to a file needs to be readable and writable 
         */
        return FALSE;
    }
    else
    {
        /* Action is permissible */
        return TRUE;
    }
}